

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledOutputFile::initialize(TiledOutputFile *this,Header *header)

{
  long lVar1;
  bool bVar2;
  Format FVar3;
  LineOrder *pLVar4;
  TileDescription *pTVar5;
  long lVar6;
  size_t sVar7;
  ArgExc *this_00;
  TileOffsets *pTVar8;
  TileBuffer *this_01;
  Compressor *comp;
  reference ppTVar9;
  long in_RDI;
  Compressor *compressor;
  TileOffsets *numXTiles;
  size_t i;
  Box2i *dataWindow;
  string *in_stack_000000d8;
  Header *in_stack_000000e0;
  Header *in_stack_ffffffffffffff60;
  int **in_stack_ffffffffffffff70;
  Header *in_stack_ffffffffffffff78;
  Header *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  LevelMode in_stack_ffffffffffffffbc;
  TileOffsets *pTVar10;
  TileOffsets *this_02;
  size_t in_stack_ffffffffffffffc8;
  Compression in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined8 local_20;
  Box2i *local_18;
  
  Header::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pLVar4 = Header::lineOrder((Header *)0x2403d3);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0x88) = *pLVar4;
  pTVar5 = Header::tileDescription((Header *)0x2403f0);
  lVar6 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar6 + 0x40) = *(undefined8 *)pTVar5;
  *(undefined8 *)(lVar6 + 0x48) = *(undefined8 *)&pTVar5->mode;
  bVar2 = Header::hasType((Header *)0x240414);
  if (bVar2) {
    Header::setType(in_stack_000000e0,in_stack_000000d8);
  }
  local_18 = Header::dataWindow((Header *)0x24043d);
  *(int *)(*(long *)(in_RDI + 8) + 0x8c) = (local_18->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0x90) = (local_18->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0x94) = (local_18->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0x98) = (local_18->max).y;
  numXTiles = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xb0);
  compressor = (Compressor *)(*(long *)(in_RDI + 8) + 0x9c);
  lVar6 = *(long *)(in_RDI + 8) + 0xa0;
  precalculateTileInfo
            ((TileDescription *)in_stack_ffffffffffffff60,(int)((ulong)lVar6 >> 0x20),(int)lVar6,
             (int)((ulong)compressor >> 0x20),(int)compressor,(int **)numXTiles,
             in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff78,
             (int *)in_stack_ffffffffffffff80);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x88) == 0) {
    anon_unknown_5::TileCoord::TileCoord((TileCoord *)&local_28,0,0,0,0);
  }
  else {
    anon_unknown_5::TileCoord::TileCoord
              ((TileCoord *)&local_28,0,**(int **)(*(long *)(in_RDI + 8) + 0xb0) + -1,0,0);
  }
  lVar1 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar1 + 0x160) = local_28;
  *(undefined8 *)(lVar1 + 0x168) = local_20;
  sVar7 = calculateBytesPerPixel(in_stack_ffffffffffffff60);
  *(size_t *)(*(long *)(in_RDI + 8) + 0x100) = sVar7 * *(uint *)(*(long *)(in_RDI + 8) + 0x40);
  *(ulong *)(*(long *)(in_RDI + 8) + 0x120) =
       *(long *)(*(long *)(in_RDI + 8) + 0x100) * (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x44);
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x120) < 0x80000000) {
    pTVar10 = (TileOffsets *)0x0;
    while (this_02 = pTVar10,
          pTVar8 = (TileOffsets *)
                   std::
                   vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                   ::size((vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                           *)(*(long *)(in_RDI + 8) + 0x108)), pTVar10 < pTVar8) {
      this_01 = (TileBuffer *)operator_new(0x88);
      Header::compression((Header *)0x24069e);
      comp = newTileCompressor(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,(size_t)this_02,
                               (Header *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      anon_unknown_5::TileBuffer::TileBuffer(this_01,comp);
      ppTVar9 = std::
                vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                              *)(*(long *)(in_RDI + 8) + 0x108),(size_type)this_02);
      *ppTVar9 = this_01;
      std::
      vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
      ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x108),(size_type)this_02);
      Array<char>::resizeErase((Array<char> *)in_stack_ffffffffffffff60,lVar6);
      pTVar10 = (TileOffsets *)((long)&this_02->_mode + 1);
    }
    std::
    vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
    ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x108),0);
    FVar3 = defaultFormat(compressor);
    *(Format *)(*(long *)(in_RDI + 8) + 0xe0) = FVar3;
    TileOffsets::TileOffsets
              (this_02,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4
               ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    TileOffsets::operator=((TileOffsets *)compressor,numXTiles);
    TileOffsets::~TileOffsets((TileOffsets *)0x240808);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Tile size too large for OpenEXR format");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::initialize (const Header& header)
{
    _data->header    = header;
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // 'Fix' the type attribute if it exists but is incorrectly set
    // (attribute is optional, but ensure it is correct if it exists)
    //
    if (_data->header.hasType ()) { _data->header.setType (TILEDIMAGE); }

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    _data->maxBytesPerTileLine =
        calculateBytesPerPixel (_data->header) * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // OpenEXR has a limit of INT_MAX compressed bytes per tile
    // disallow uncompressed tile sizes above INT_MAX too to guarantee file is written
    //
    if (_data->tileBufferSize > INT_MAX)
    {
        throw IEX_NAMESPACE::ArgExc ("Tile size too large for OpenEXR format");
    }

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor (
            _data->header.compression (),
            _data->maxBytesPerTileLine,
            _data->tileDesc.ySize,
            _data->header));

        _data->tileBuffers[i]->buffer.resizeErase (_data->tileBufferSize);
    }

    _data->format = defaultFormat (_data->tileBuffers[0]->compressor);

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);
}